

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O1

void xe::removeEmptyGroups
               (set<const_xe::TestNode_*,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
                *nodeSet,TestGroup *group)

{
  _Rb_tree_header *p_Var1;
  pointer ppTVar2;
  TestNode *pTVar3;
  TestGroup *group_00;
  uint uVar4;
  ulong uVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  bool bVar8;
  pair<std::_Rb_tree_iterator<const_xe::TestNode_*>,_std::_Rb_tree_iterator<const_xe::TestNode_*>_>
  pVar9;
  TestGroup *local_20;
  
  ppTVar2 = (group->m_children).super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar4 = (uint)((ulong)((long)(group->m_children).
                               super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar2) >> 3);
  bVar8 = 0 < (int)uVar4;
  if (0 < (int)uVar4) {
    p_Var1 = &(nodeSet->_M_t)._M_impl.super__Rb_tree_header;
    bVar8 = true;
    uVar5 = 0;
    do {
      pTVar3 = ppTVar2[uVar5];
      p_Var7 = (nodeSet->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var6 = &p_Var1->_M_header;
      for (; p_Var7 != (_Base_ptr)0x0;
          p_Var7 = (&p_Var7->_M_left)[*(TestNode **)(p_Var7 + 1) < pTVar3]) {
        if (*(TestNode **)(p_Var7 + 1) >= pTVar3) {
          p_Var6 = p_Var7;
        }
      }
      p_Var7 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
         (p_Var7 = p_Var6, pTVar3 < *(TestNode **)(p_Var6 + 1))) {
        p_Var7 = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)p_Var7 != p_Var1) break;
      uVar5 = uVar5 + 1;
      bVar8 = uVar5 < (uVar4 & 0x7fffffff);
    } while (uVar5 != (uVar4 & 0x7fffffff));
  }
  if (!bVar8) {
    local_20 = group;
    pVar9 = std::
            _Rb_tree<const_xe::TestNode_*,_const_xe::TestNode_*,_std::_Identity<const_xe::TestNode_*>,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
            ::equal_range(&nodeSet->_M_t,(key_type *)&local_20);
    std::
    _Rb_tree<const_xe::TestNode_*,_const_xe::TestNode_*,_std::_Identity<const_xe::TestNode_*>,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
    ::_M_erase_aux(&nodeSet->_M_t,(_Base_ptr)pVar9.first._M_node,(_Base_ptr)pVar9.second._M_node);
    group_00 = (group->super_TestNode).m_parent;
    if (group_00 != (TestGroup *)0x0) {
      removeEmptyGroups(nodeSet,group_00);
    }
  }
  return;
}

Assistant:

static void removeEmptyGroups (std::set<const TestNode*>& nodeSet, const TestGroup* group)
{
	if (!hasChildrenInSet(nodeSet, group))
	{
		nodeSet.erase(group);
		if (group->getParent() != DE_NULL)
			removeEmptyGroups(nodeSet, group->getParent());
	}
}